

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O2

ngx_int_t ngx_walk_tree(ngx_tree_ctx_t *ctx,ngx_str_t *tree)

{
  DIR *__s;
  DIR DVar1;
  void *pvVar2;
  DIR *pDVar3;
  u_char *puVar4;
  uint uVar5;
  int iVar6;
  ngx_int_t nVar7;
  size_t sVar8;
  long lVar9;
  int *piVar10;
  __dev_t _Var11;
  char *pcVar12;
  ngx_err_t err;
  size_t __n;
  ngx_log_t *pnVar13;
  ngx_uint_t level;
  u_char *puVar14;
  ulong uVar15;
  ngx_int_t nStack_120;
  undefined1 local_118 [8];
  ngx_dir_t dir;
  void *local_60;
  undefined1 local_58 [8];
  ngx_str_t file;
  ulong local_38;
  
  if ((ctx->log->log_level & 0x10) != 0) {
    ngx_log_error_core(8,ctx->log,0,"walk tree \"%V\"",tree);
  }
  nVar7 = ngx_open_dir(tree,(ngx_dir_t *)local_118);
  if (nVar7 == -1) {
    pnVar13 = ctx->log;
    nStack_120 = -1;
    if (pnVar13->log_level < 3) {
      return -1;
    }
    piVar10 = __errno_location();
    iVar6 = *piVar10;
    puVar14 = tree->data;
    pcVar12 = "opendir() \"%s\" failed";
    goto LAB_0011aee5;
  }
  pvVar2 = ctx->data;
  if (ctx->alloc == 0) {
    local_60 = (void *)0x0;
LAB_0011ab2e:
    piVar10 = __errno_location();
    file.data = (u_char *)0x0;
    local_38 = 0;
    dir._160_8_ = piVar10;
LAB_0011ab4a:
    do {
      *piVar10 = 0;
      nVar7 = ngx_read_dir((ngx_dir_t *)local_118);
      pDVar3 = dir.dir;
      if (nVar7 == -1) {
        if (*piVar10 == 0) {
          nStack_120 = 0;
        }
        else {
          nStack_120 = -1;
          if (2 < ctx->log->log_level) {
            ngx_log_error_core(3,ctx->log,*piVar10,"readdir() \"%s\" failed",tree->data);
          }
        }
        break;
      }
      __s = dir.dir + 0x13;
      sVar8 = strlen((char *)__s);
      if ((ctx->log->log_level & 0x10) != 0) {
        ngx_log_error_core(8,ctx->log,0,"tree name %uz:\"%s\"",sVar8,__s);
      }
      if (sVar8 == 2) {
        if (*__s == (DIR)0x2e) {
          DVar1 = pDVar3[0x14];
          goto joined_r0x0011abba;
        }
      }
      else if (sVar8 == 1) {
        DVar1 = *__s;
joined_r0x0011abba:
        if (DVar1 == (DIR)0x2e) goto LAB_0011ab4a;
      }
      __n = tree->len;
      uVar15 = sVar8 + __n + 1;
      local_58 = (undefined1  [8])uVar15;
      if (local_38 < uVar15) {
        if (local_38 != 0) {
          free(file.data);
          uVar15 = tree->len + sVar8 + 1;
        }
        file.data = (u_char *)ngx_alloc(uVar15 + 1,ctx->log);
        local_38 = uVar15;
        if (file.data == (u_char *)0x0) {
          file.data = (u_char *)0x0;
          nStack_120 = -6;
          break;
        }
        __n = tree->len;
      }
      puVar4 = file.data;
      memcpy(file.data,tree->data,__n);
      puVar14 = puVar4 + tree->len;
      *puVar14 = '/';
      memcpy(puVar14 + 1,__s,sVar8 + 1);
      file.len = (size_t)puVar4;
      nStack_120 = -6;
      if ((ctx->log->log_level & 0x10) != 0) {
        ngx_log_error_core(8,ctx->log,0,"tree path \"%s\"",file.data);
      }
      piVar10 = (int *)dir._160_8_;
      uVar5 = (uint)dir.info.__glibc_reserved[2];
      if (((uint)dir.info.__glibc_reserved[2] >> 8 & 1) == 0) {
        dir.info.__glibc_reserved[2]._0_4_ = (uint)dir.info.__glibc_reserved[2] & 0xfffffe00;
        iVar6 = stat64((char *)file.len,(stat64 *)&dir.de);
        if (iVar6 != -1) {
          uVar5 = (uint)dir.info.__glibc_reserved[2] & 0xffff;
          goto LAB_0011aca5;
        }
        pnVar13 = ctx->log;
        if (2 < pnVar13->log_level) {
          err = *piVar10;
          level = 3;
          pcVar12 = "stat() \"%s\" failed";
LAB_0011ae4c:
          ngx_log_error_core(level,pnVar13,err,pcVar12,file.len);
        }
        goto LAB_0011ab4a;
      }
LAB_0011aca5:
      if ((char)uVar5 == '\b') {
LAB_0011acdb:
        if ((ctx->log->log_level & 0x10) != 0) {
          ngx_log_error_core(8,ctx->log,0,"tree file \"%s\"",file.len);
        }
        ctx->size = dir.info.st_rdev;
        _Var11 = dir.info.st_blksize * 0x200;
        if (dir.info.st_blksize * 0x200 < (long)dir.info.st_rdev) {
          _Var11 = dir.info.st_rdev;
        }
        ctx->fs_size = _Var11;
        ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
        ctx->mtime = dir.info.st_atim.tv_nsec;
        lVar9 = (*ctx->file_handler)(ctx,(ngx_str_t *)local_58);
      }
      else if ((uVar5 & 0xff) == 4) {
LAB_0011ad44:
        if ((ctx->log->log_level & 0x10) != 0) {
          ngx_log_error_core(8,ctx->log,0,"tree enter dir \"%s\"",file.len);
        }
        ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
        ctx->mtime = dir.info.st_atim.tv_nsec;
        nVar7 = (*ctx->pre_tree_handler)(ctx,(ngx_str_t *)local_58);
        if (nVar7 == -5) {
          pnVar13 = ctx->log;
          if ((pnVar13->log_level & 0x10) != 0) {
            level = 8;
            err = 0;
            pcVar12 = "tree skip dir \"%s\"";
            goto LAB_0011ae4c;
          }
          goto LAB_0011ab4a;
        }
        if (nVar7 == -6) {
          nStack_120 = -6;
          break;
        }
        nVar7 = ngx_walk_tree(ctx,(ngx_str_t *)local_58);
        if (nVar7 == -6) break;
        ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
        ctx->mtime = dir.info.st_atim.tv_nsec;
        lVar9 = (*ctx->post_tree_handler)(ctx,(ngx_str_t *)local_58);
      }
      else {
        if ((uVar5 & 0xff) == 0) {
          if ((short)((uint)dir.info.st_nlink & 0xf000) == 0x4000) goto LAB_0011ad44;
          if (((uint)dir.info.st_nlink & 0xf000) == 0x8000) goto LAB_0011acdb;
        }
        if ((ctx->log->log_level & 0x10) != 0) {
          ngx_log_error_core(8,ctx->log,0,"tree special \"%s\"",file.len);
        }
        lVar9 = (*ctx->spec_handler)(ctx,(ngx_str_t *)local_58);
      }
    } while (lVar9 != -6);
    if (local_38 != 0) {
      free(file.data);
    }
    if (local_60 != (void *)0x0) {
LAB_0011aeab:
      free(local_60);
      ctx->data = pvVar2;
    }
  }
  else {
    local_60 = ngx_alloc(ctx->alloc,ctx->log);
    if (local_60 != (void *)0x0) {
      nVar7 = (*ctx->init_handler)(local_60,pvVar2);
      if (nVar7 != -6) {
        ctx->data = local_60;
        goto LAB_0011ab2e;
      }
      nStack_120 = -6;
      goto LAB_0011aeab;
    }
    nStack_120 = -6;
  }
  iVar6 = closedir((DIR *)local_118);
  if (iVar6 != -1) {
    return nStack_120;
  }
  pnVar13 = ctx->log;
  if (pnVar13->log_level < 3) {
    return nStack_120;
  }
  piVar10 = __errno_location();
  iVar6 = *piVar10;
  puVar14 = tree->data;
  pcVar12 = "closedir() \"%s\" failed";
LAB_0011aee5:
  ngx_log_error_core(3,pnVar13,iVar6,pcVar12,puVar14);
  return nStack_120;
}

Assistant:

ngx_int_t
ngx_walk_tree(ngx_tree_ctx_t *ctx, ngx_str_t *tree)
{
    void       *data, *prev;
    u_char     *p, *name;
    size_t      len;
    ngx_int_t   rc;
    ngx_err_t   err;
    ngx_str_t   file, buf;
    ngx_dir_t   dir;

    ngx_str_null(&buf);

    ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                   "walk tree \"%V\"", tree);

    if (ngx_open_dir(tree, &dir) == NGX_ERROR) {
        ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                      ngx_open_dir_n " \"%s\" failed", tree->data);
        return NGX_ERROR;
    }

    prev = ctx->data;

    if (ctx->alloc) {
        data = ngx_alloc(ctx->alloc, ctx->log);
        if (data == NULL) {
            goto failed;
        }

        if (ctx->init_handler(data, prev) == NGX_ABORT) {
            goto failed;
        }

        ctx->data = data;

    } else {
        data = NULL;
    }

    for ( ;; ) {

        ngx_set_errno(0);

        if (ngx_read_dir(&dir) == NGX_ERROR) {
            err = ngx_errno;

            if (err == NGX_ENOMOREFILES) {
                rc = NGX_OK;

            } else {
                ngx_log_error(NGX_LOG_CRIT, ctx->log, err,
                              ngx_read_dir_n " \"%s\" failed", tree->data);
                rc = NGX_ERROR;
            }

            goto done;
        }

        len = ngx_de_namelen(&dir);
        name = ngx_de_name(&dir);

        ngx_log_debug2(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                      "tree name %uz:\"%s\"", len, name);

        if (len == 1 && name[0] == '.') {
            continue;
        }

        if (len == 2 && name[0] == '.' && name[1] == '.') {
            continue;
        }

        file.len = tree->len + 1 + len;

        if (file.len + NGX_DIR_MASK_LEN > buf.len) {

            if (buf.len) {
                ngx_free(buf.data);
            }

            buf.len = tree->len + 1 + len + NGX_DIR_MASK_LEN;

            buf.data = ngx_alloc(buf.len + 1, ctx->log);
            if (buf.data == NULL) {
                goto failed;
            }
        }

        p = ngx_cpymem(buf.data, tree->data, tree->len);
        *p++ = '/';
        ngx_memcpy(p, name, len + 1);

        file.data = buf.data;

        ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                       "tree path \"%s\"", file.data);

        if (!dir.valid_info) {
            if (ngx_de_info(file.data, &dir) == NGX_FILE_ERROR) {
                ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                              ngx_de_info_n " \"%s\" failed", file.data);
                continue;
            }
        }

        if (ngx_de_is_file(&dir)) {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree file \"%s\"", file.data);

            ctx->size = ngx_de_size(&dir);
            ctx->fs_size = ngx_de_fs_size(&dir);
            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            if (ctx->file_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

        } else if (ngx_de_is_dir(&dir)) {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree enter dir \"%s\"", file.data);

            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            rc = ctx->pre_tree_handler(ctx, &file);

            if (rc == NGX_ABORT) {
                goto failed;
            }

            if (rc == NGX_DECLINED) {
                ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                               "tree skip dir \"%s\"", file.data);
                continue;
            }

            if (ngx_walk_tree(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            if (ctx->post_tree_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

        } else {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree special \"%s\"", file.data);

            if (ctx->spec_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }
        }
    }

failed:

    rc = NGX_ABORT;

done:

    if (buf.len) {
        ngx_free(buf.data);
    }

    if (data) {
        ngx_free(data);
        ctx->data = prev;
    }

    if (ngx_close_dir(&dir) == NGX_ERROR) {
        ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                      ngx_close_dir_n " \"%s\" failed", tree->data);
    }

    return rc;
}